

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::left(dynamic_string *this,uint len)

{
  dynamic_string *pdVar1;
  uint in_ESI;
  dynamic_string *in_RDI;
  uint in_stack_fffffffffffffff0;
  
  pdVar1 = substring(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  return pdVar1;
}

Assistant:

dynamic_string& dynamic_string::left(uint len) {
  return substring(0, len);
}